

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(char *str_id)

{
  ImVector<unsigned_int> *this;
  ImGuiID local_1c;
  ImGuiWindow *local_18;
  ImGuiWindow *window;
  char *str_id_local;
  
  window = (ImGuiWindow *)str_id;
  local_18 = GetCurrentWindowRead();
  this = &local_18->IDStack;
  local_1c = ImGuiWindow::GetID(local_18,(char *)window,(char *)0x0);
  ImVector<unsigned_int>::push_back(this,&local_1c);
  return;
}

Assistant:

void ImGui::PushID(const char* str_id)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    window->IDStack.push_back(window->GetID(str_id));
}